

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Block *block)

{
  Index IVar1;
  intrusive_list<wabt::Expr> *t;
  string_view name;
  LabelDecl local_70;
  size_t local_50;
  size_t mark;
  char *local_40;
  undefined1 local_38 [8];
  string label;
  Block *block_local;
  CWriter *this_local;
  
  label.field_2._8_8_ = block;
  name = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)block);
  local_40 = name._M_str;
  mark = name._M_len;
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_
            ((string *)local_38,(CWriter *)this,name);
  IVar1 = FuncDeclaration::GetNumParams((FuncDeclaration *)(label.field_2._8_8_ + 0x20));
  DropTypes(this,(ulong)IVar1);
  local_50 = MarkTypeStack(this);
  PushLabel(this,Block,(string *)label.field_2._8_8_,(FuncSignature *)(label.field_2._8_8_ + 0x70),
            false);
  PushTypes(this,(TypeVector *)(label.field_2._8_8_ + 0x70));
  t = (intrusive_list<wabt::Expr> *)(label.field_2._8_8_ + 0xa0);
  LabelDecl::LabelDecl(&local_70,(string *)local_38);
  (anonymous_namespace)::CWriter::
  Write<wabt::intrusive_list<wabt::Expr>const&,wabt::(anonymous_namespace)::LabelDecl>
            ((CWriter *)this,t,&local_70);
  LabelDecl::~LabelDecl(&local_70);
  ResetTypeStack(this,local_50);
  PopLabel(this);
  PushTypes(this,(TypeVector *)(label.field_2._8_8_ + 0x88));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CWriter::Write(const Block& block) {
  std::string label = DefineLabelName(block.label);
  DropTypes(block.decl.GetNumParams());
  size_t mark = MarkTypeStack();
  PushLabel(LabelType::Block, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write(block.exprs, LabelDecl(label));
  ResetTypeStack(mark);
  PopLabel();
  PushTypes(block.decl.sig.result_types);
}